

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastErrorMessage::Operation<duckdb::string_t,duckdb::date_t>
          (TryCastErrorMessage *this,string_t input,date_t *result,CastParameters *parameters)

{
  DateCastResult DVar1;
  char *buf;
  bool special;
  idx_t pos;
  bool local_49;
  undefined8 local_48;
  char *local_40;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffffc8;
  idx_t local_18;
  
  local_40 = input.value._0_8_;
  local_49 = false;
  buf = (char *)((long)&local_48 + 4);
  if (0xc < (uint)this) {
    buf = local_40;
  }
  local_48 = this;
  DVar1 = Date::TryConvertDate
                    (buf,(ulong)this & 0xffffffff,&local_18,input.value._8_8_,&local_49,
                     SUB41(result[2].days,0));
  if (DVar1 == ERROR_RANGE) {
    Date::RangeError_abi_cxx11_((string_t)in_stack_ffffffffffffffc8);
    HandleCastError::AssignError((string *)&stack0xffffffffffffffc8,(CastParameters *)result);
  }
  else {
    if (DVar1 != ERROR_INCORRECT_FORMAT) {
      return true;
    }
    Date::FormatError_abi_cxx11_((string_t)in_stack_ffffffffffffffc8);
    HandleCastError::AssignError((string *)&stack0xffffffffffffffc8,(CastParameters *)result);
  }
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return false;
}

Assistant:

bool TryCastErrorMessage::Operation(string_t input, date_t &result, CastParameters &parameters) {
	idx_t pos;
	bool special = false;
	switch (Date::TryConvertDate(input.GetData(), input.GetSize(), pos, result, special, parameters.strict)) {
	case DateCastResult::SUCCESS:
		break;
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		HandleCastError::AssignError(Date::FormatError(input), parameters);
		return false;
	case DateCastResult::ERROR_RANGE:
		HandleCastError::AssignError(Date::RangeError(input), parameters);
		return false;
	}
	return true;
}